

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O1

void __thiscall
nestl::impl::detail::
rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
::m_erase(rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
          *this,link_type x)

{
  rb_tree_node<int> *prVar1;
  
  if (x != (link_type)0x0) {
    do {
      m_erase(this,(link_type)(x->super_rb_tree_node_base).m_right);
      prVar1 = (rb_tree_node<int> *)(x->super_rb_tree_node_base).m_left;
      test::allocator_with_state<nestl::impl::detail::rb_tree_node<int>_>::deallocate
                ((allocator_with_state<nestl::impl::detail::rb_tree_node<int>_> *)this,x,1);
      x = prVar1;
    } while (prVar1 != (rb_tree_node<int> *)0x0);
  }
  return;
}

Assistant:

void
rb_tree<Key, Val, KeyOfValue, Compare, Alloc>::m_erase(link_type x) NESTL_NOEXCEPT_SPEC
{
    // Erase without rebalancing.
    while (x != 0)
    {
        m_erase(s_right(x));
        link_type y = s_left(x);
        m_destroy_node(x);
        x = y;
    }
}